

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

void __thiscall FScanner::OpenLumpNum(FScanner *this,int lump)

{
  undefined1 local_40 [32];
  undefined1 local_20 [8];
  FMemLump mem;
  int lump_local;
  FScanner *this_local;
  
  mem.Block.Chars._4_4_ = lump;
  Close(this);
  FWadCollection::ReadLump((FWadCollection *)local_20,0x1f756a0);
  FMemLump::GetString((FMemLump *)(local_40 + 0x18));
  FString::operator=(&this->ScriptBuffer,(FString *)(local_40 + 0x18));
  FString::~FString((FString *)(local_40 + 0x18));
  FMemLump::~FMemLump((FMemLump *)local_20);
  FWadCollection::GetLumpFullPath((FWadCollection *)local_40,0x1f756a0);
  FString::operator=(&this->ScriptName,(FString *)local_40);
  FString::~FString((FString *)local_40);
  this->LumpNum = mem.Block.Chars._4_4_;
  PrepareScript(this);
  return;
}

Assistant:

void FScanner :: OpenLumpNum (int lump)
{
	Close ();
	{
		FMemLump mem = Wads.ReadLump(lump);
		ScriptBuffer = mem.GetString();
	}
	ScriptName = Wads.GetLumpFullPath(lump);
	LumpNum = lump;
	PrepareScript ();
}